

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O2

t2<unsigned_int,_idx2::channel_*> *
idx2::BinarySearch<idx2::t2<unsigned_int,idx2::channel*>,idx2::t2<unsigned_int,idx2::channel*>*>
          (t2<unsigned_int,_idx2::channel_*> *Beg,t2<unsigned_int,_idx2::channel_*> *End,
          t2<unsigned_int,_idx2::channel_*> *Val)

{
  t2<unsigned_int,_idx2::channel_*> *ptVar1;
  undefined1 auVar2 [16];
  long lVar3;
  
  do {
    while( true ) {
      if (End <= Beg) {
        return End;
      }
      auVar2._8_8_ = (long)End - (long)Beg >> 0x3f;
      auVar2._0_8_ = (long)End - (long)Beg >> 4;
      lVar3 = SUB168(auVar2 / SEXT816(2),0);
      ptVar1 = Beg + lVar3;
      if (Val->First <= Beg[lVar3].First) break;
      Beg = ptVar1 + 1;
    }
    End = ptVar1;
  } while (Val->First < Beg[lVar3].First);
  return ptVar1;
}

Assistant:

i
BinarySearch(i Beg, i End, const t& Val)
{
  while (Beg < End)
  {
    i Mid = Beg + (End - Beg) / 2;
    if (*Mid < Val)
    {
      Beg = Mid + 1;
      continue;
    }
    else if (Val < *Mid)
    {
      End = Mid;
      continue;
    }
    return Mid;
  }
  return End;
}